

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_proto.cpp
# Opt level: O3

void caffe::UpgradeNetInput(NetParameter *net_param)

{
  RepeatedPtrField<caffe::LayerParameter> *this;
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int iVar4;
  RepeatedPtrFieldBase *pRVar5;
  LayerParameter *this_00;
  Type *pTVar6;
  InputParameter *this_01;
  Type *value;
  Type *this_02;
  Type *from;
  int *piVar7;
  Type *other;
  BlobShape *shape;
  int index;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int j;
  string local_80;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  LayerParameter *local_40;
  ulong local_38;
  
  iVar3 = (net_param->input_shape_).super_RepeatedPtrFieldBase.current_size_;
  if ((0 < iVar3) || (0 < (net_param->input_dim_).current_size_)) {
    this = &net_param->layer_;
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                       (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
    *(byte *)(pTVar6->_has_bits_).has_bits_ = (byte)(pTVar6->_has_bits_).has_bits_[0] | 1;
    paVar2 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"input","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pTVar6->name_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    *(byte *)(pTVar6->_has_bits_).has_bits_ = (byte)(pTVar6->_has_bits_).has_bits_[0] | 2;
    local_80._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Input","");
    google::protobuf::internal::ArenaStringPtr::SetNoArena
              (&pTVar6->type_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               &local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pbVar1 = (byte *)((long)(pTVar6->_has_bits_).has_bits_ + 5);
    *pbVar1 = *pbVar1 | 0x20;
    this_01 = pTVar6->input_param_;
    if (this_01 == (InputParameter *)0x0) {
      this_01 = (InputParameter *)operator_new(0x30);
      InputParameter::InputParameter(this_01);
      pTVar6->input_param_ = this_01;
    }
    local_60 = &this->super_RepeatedPtrFieldBase;
    if (0 < (net_param->input_).super_RepeatedPtrFieldBase.current_size_) {
      local_50 = &(net_param->input_).super_RepeatedPtrFieldBase;
      local_48 = &(this_01->shape_).super_RepeatedPtrFieldBase;
      local_58 = &(net_param->input_shape_).super_RepeatedPtrFieldBase;
      uVar10 = 0;
      local_40 = pTVar6;
      do {
        this_00 = local_40;
        pRVar5 = local_48;
        index = (int)uVar10;
        value = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          (local_50,index);
        LayerParameter::add_top(this_00,value);
        this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                            (pRVar5,(Type *)0x0);
        local_38 = uVar10;
        if (iVar3 < 1) {
          uVar9 = index * 4;
          do {
            piVar7 = google::protobuf::RepeatedField<int>::Get(&net_param->input_dim_,uVar9);
            iVar4 = *piVar7;
            iVar8 = (this_02->dim_).current_size_;
            if (iVar8 == (this_02->dim_).total_size_) {
              google::protobuf::RepeatedField<long>::Reserve(&this_02->dim_,iVar8 + 1);
              iVar8 = (this_02->dim_).current_size_;
            }
            (this_02->dim_).current_size_ = iVar8 + 1;
            ((this_02->dim_).rep_)->elements[iVar8] = (long)iVar4;
            uVar9 = uVar9 + 1;
          } while (uVar9 < index * 4 + 4U);
        }
        else {
          from = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                           (local_58,index);
          BlobShape::CopyFrom(this_02,from);
        }
        uVar9 = (int)local_38 + 1;
        uVar10 = (ulong)uVar9;
      } while ((int)uVar9 < (net_param->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    pRVar5 = local_60;
    iVar3 = (net_param->layer_).super_RepeatedPtrFieldBase.current_size_;
    if (1 < iVar3) {
      uVar9 = iVar3 + 1;
      do {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                           (pRVar5,uVar9 - 3);
        other = google::protobuf::internal::RepeatedPtrFieldBase::
                Mutable<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                          (pRVar5,uVar9 - 2);
        LayerParameter::Swap(pTVar6,other);
        uVar9 = uVar9 - 1;
      } while (2 < uVar9);
    }
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(net_param->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
            (&(net_param->input_shape_).super_RepeatedPtrFieldBase);
  (net_param->input_dim_).current_size_ = 0;
  return;
}

Assistant:

void UpgradeNetInput(NetParameter* net_param) {
  // Collect inputs and convert to Input layer definitions.
  // If the NetParameter holds an input alone, without shape/dim, then
  // it's a legacy caffemodel and simply stripping the input field is enough.
  bool has_shape = net_param->input_shape_size() > 0;
  bool has_dim = net_param->input_dim_size() > 0;
  if (has_shape || has_dim) {
    LayerParameter* layer_param = net_param->add_layer();
    layer_param->set_name("input");
    layer_param->set_type("Input");
    InputParameter* input_param = layer_param->mutable_input_param();
    // Convert input fields into a layer.
    for (int i = 0; i < net_param->input_size(); ++i) {
      layer_param->add_top(net_param->input(i));
      if (has_shape) {
        input_param->add_shape()->CopyFrom(net_param->input_shape(i));
      } else {
        // Turn legacy input dimensions into shape.
        BlobShape* shape = input_param->add_shape();
        int first_dim = i*4;
        int last_dim = first_dim + 4;
        for (int j = first_dim; j < last_dim; j++) {
          shape->add_dim(net_param->input_dim(j));
        }
      }
    }
    // Swap input layer to beginning of net to satisfy layer dependencies.
    for (int i = net_param->layer_size() - 1; i > 0; --i) {
      net_param->mutable_layer(i-1)->Swap(net_param->mutable_layer(i));
    }
  }
  // Clear inputs.
  net_param->clear_input();
  net_param->clear_input_shape();
  net_param->clear_input_dim();
}